

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::ArgumentParser
          (ArgumentParser *this,string *program_name,string *version,default_arguments add_args,
          bool exit_on_default_arguments,ostream *os)

{
  default_arguments dVar1;
  Argument *pAVar2;
  enable_if_t<std::is_invocable_v<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_WEYTEC[P]LMSS_src_argparse_hpp:1450:19),_const_std::string>,_Argument_&>
  this_00;
  enable_if_t<std::is_invocable_v<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_WEYTEC[P]LMSS_src_argparse_hpp:1463:19),_const_std::string>,_Argument_&>
  this_01;
  bool local_f9;
  any local_f8;
  allocator<char> local_e1;
  string local_e0;
  bool local_b9;
  anon_class_16_2_e880815f local_b8;
  default_arguments local_a8;
  bool local_a1;
  any local_a0;
  allocator<char> local_89;
  string local_88;
  bool local_61;
  anon_class_16_2_e880815f local_60;
  default_arguments local_4c;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  ostream *local_30;
  ostream *os_local;
  bool exit_on_default_arguments_local;
  string *psStack_20;
  default_arguments add_args_local;
  string *version_local;
  string *program_name_local;
  ArgumentParser *this_local;
  
  local_30 = os;
  os_local._3_1_ = exit_on_default_arguments;
  os_local._4_4_ = add_args;
  psStack_20 = version;
  version_local = program_name;
  program_name_local = &this->m_program_name;
  std::__cxx11::string::string((string *)this,program_name);
  std::__cxx11::string::string((string *)&this->m_version,version);
  std::__cxx11::string::string((string *)&this->m_description);
  std::__cxx11::string::string((string *)&this->m_epilog);
  this->m_exit_on_default_arguments = (bool)(os_local._3_1_ & 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_prefix_chars,"-",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_assign_chars,"=",local_45);
  std::allocator<char>::~allocator(local_45);
  this->m_is_parsed = false;
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->m_positional_arguments);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::list
            (&this->m_optional_arguments);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::map(&this->m_argument_map);
  std::__cxx11::string::string((string *)&this->m_parser_path,&this->m_program_name);
  std::__cxx11::
  list<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ::list(&this->m_subparsers);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
  ::map(&this->m_subparser_map);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
  ::map(&this->m_subparser_used);
  std::
  vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ::vector(&this->m_mutually_exclusive_groups);
  this->m_suppress = false;
  local_4c = help;
  dVar1 = operator&((default_arguments *)((long)&os_local + 4),&local_4c);
  if (dVar1 == help) {
    pAVar2 = add_argument<char_const*,char_const*>(this,"-h","--help");
    local_60.os = local_30;
    local_60.this = this;
    this_00 = Argument::
              action<argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments,bool,std::ostream&)::_lambda(auto:1_const&)_1_>
                        (pAVar2,&local_60);
    local_61 = false;
    pAVar2 = Argument::default_value<bool>(this_00,&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"shows help message and exits",&local_89);
    pAVar2 = Argument::help(pAVar2,&local_88);
    local_a1 = true;
    std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_a0,&local_a1);
    pAVar2 = Argument::implicit_value(pAVar2,&local_a0);
    Argument::nargs(pAVar2,0);
    std::any::~any(&local_a0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  local_a8 = version;
  dVar1 = operator&((default_arguments *)((long)&os_local + 4),&local_a8);
  if (dVar1 == version) {
    pAVar2 = add_argument<char_const*,char_const*>(this,"-v","--version");
    local_b8.os = local_30;
    local_b8.this = this;
    this_01 = Argument::
              action<argparse::ArgumentParser::ArgumentParser(std::__cxx11::string,std::__cxx11::string,argparse::default_arguments,bool,std::ostream&)::_lambda(auto:1_const&)_2_>
                        (pAVar2,&local_b8);
    local_b9 = false;
    pAVar2 = Argument::default_value<bool>(this_01,&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"prints version information and exits",&local_e1);
    pAVar2 = Argument::help(pAVar2,&local_e0);
    local_f9 = true;
    std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_f8,&local_f9);
    pAVar2 = Argument::implicit_value(pAVar2,&local_f8);
    Argument::nargs(pAVar2,0);
    std::any::~any(&local_f8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string program_name = {},
                          std::string version = "1.0",
                          default_arguments add_args = default_arguments::all,
                          bool exit_on_default_arguments = true,
                          std::ostream &os = std::cout)
      : m_program_name(std::move(program_name)), m_version(std::move(version)),
        m_exit_on_default_arguments(exit_on_default_arguments),
        m_parser_path(m_program_name) {
    if ((add_args & default_arguments::help) == default_arguments::help) {
      add_argument("-h", "--help")
          .action([&](const auto & /*unused*/) {
            os << help().str();
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("shows help message and exits")
          .implicit_value(true)
          .nargs(0);
    }
    if ((add_args & default_arguments::version) == default_arguments::version) {
      add_argument("-v", "--version")
          .action([&](const auto & /*unused*/) {
            os << m_version << std::endl;
            if (m_exit_on_default_arguments) {
              std::exit(0);
            }
          })
          .default_value(false)
          .help("prints version information and exits")
          .implicit_value(true)
          .nargs(0);
    }
  }